

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_bv_base.cpp
# Opt level: O3

void __thiscall sc_dt::sc_bv_base::assign_from_string(sc_bv_base *this,string *s)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  sc_digit *psVar4;
  byte bVar5;
  char cVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  
  uVar2 = this->m_len;
  iVar8 = (int)s->_M_string_length;
  uVar1 = iVar8 - 1;
  uVar10 = uVar1;
  if ((int)uVar2 < (int)uVar1) {
    uVar10 = uVar2;
  }
  uVar7 = 0;
  if (0 < (int)uVar10) {
    iVar8 = iVar8 + -2;
    uVar11 = 0;
    do {
      cVar6 = (s->_M_dataplus)._M_p[iVar8];
      if ((byte)(cVar6 - 0x32U) < 0xfe) {
        sc_core::sc_report_handler::report
                  (SC_ERROR,"cannot perform conversion",
                   "string can contain only \'0\' and \'1\' characters",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/datatypes/bit/sc_bv_base.cpp"
                   ,0x6b);
        cVar6 = '0';
      }
      uVar9 = uVar11 >> 5 & 0x7ffffff;
      bVar5 = (byte)uVar11 & 0x1f;
      this->m_data[uVar9] =
           (-2 << bVar5 | 0xfffffffeU >> 0x20 - bVar5 |
           (uint)(cVar6 != '0') << ((byte)uVar11 & 0x1f)) &
           (this->m_data[uVar9] | 1 << ((uint)uVar11 & 0x1f));
      uVar11 = uVar11 + 1;
      iVar8 = iVar8 + -1;
      uVar7 = uVar10;
    } while (uVar10 != uVar11);
  }
  uVar10 = 0;
  pcVar3 = (s->_M_dataplus)._M_p;
  if (pcVar3[(int)uVar1] == 'F') {
    uVar10 = (uint)(*pcVar3 != '0');
  }
  if ((int)uVar7 < (int)uVar2) {
    psVar4 = this->m_data;
    do {
      bVar5 = (byte)uVar7 & 0x1f;
      psVar4[uVar7 >> 5] =
           (-2 << bVar5 | 0xfffffffeU >> 0x20 - bVar5 | uVar10 << ((byte)uVar7 & 0x1f)) &
           (psVar4[uVar7 >> 5] | 1 << (uVar7 & 0x1f));
      uVar7 = uVar7 + 1;
    } while (uVar2 != uVar7);
  }
  return;
}

Assistant:

void
sc_bv_base::assign_from_string( const std::string& s )
{
    // s must have been converted to bin
    int len = m_len;
    int s_len = s.length() - 1;
    int min_len = sc_min( len, s_len );
    int i = 0;
    for( ; i < min_len; ++ i ) {
        char c = s[s_len - i - 1];
        if( c != '0' && c != '1' ) {
            SC_REPORT_ERROR( sc_core::SC_ID_CANNOT_CONVERT_,
                "string can contain only '0' and '1' characters" );
            // may continue, if suppressed
            c = '0';
        }
        set_bit( i, sc_logic_value_t( c - '0' ) );
    }
    // if formatted, fill the rest with sign(s), otherwise fill with zeros
    sc_logic_value_t fill = (s[s_len] == 'F' ? sc_logic_value_t( s[0] - '0' )
                                             : sc_logic_value_t( 0 ));
    for( ; i < len; ++ i ) {
        set_bit( i, fill );
    }
}